

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator08buggy.cpp
# Opt level: O2

double statement(void)

{
  bool is_const;
  undefined8 uVar1;
  double d;
  Token t;
  string local_88;
  undefined1 local_68 [48];
  undefined1 local_38 [48];
  
  Token_stream::get((Token *)local_38,&ts);
  if (local_38[0] == 'C') {
    is_const = true;
  }
  else {
    if (local_38[0] != '#') {
      Token::Token((Token *)local_68,(Token *)local_38);
      Token_stream::unget(&ts,(Token *)local_68);
      std::__cxx11::string::~string((string *)(local_68 + 0x10));
      d = expression();
      goto LAB_00103521;
    }
    is_const = false;
  }
  d = declaration(is_const);
LAB_00103521:
  if ((-2147483648.0 <= d) && (d <= 2147483647.0)) {
    std::__cxx11::string::~string((string *)(local_38 + 0x10));
    return d;
  }
  compose_owerflow_err_msg_abi_cxx11_(&local_88,d);
  error(&local_88);
  uVar1 = std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)(local_68 + 0x10));
  std::__cxx11::string::~string((string *)(local_38 + 0x10));
  _Unwind_Resume(uVar1);
}

Assistant:

double statement()
{
	Token t = ts.get();
	double result = 0;
	switch (t.kind)
	{
	case let:
		result = declaration();
		break;
	case constant:
		result = declaration(true);
		break;
	default:
		ts.unget(t);
		result = expression();
	}

	if (is_out_of_int32_range(result))
		error(compose_owerflow_err_msg(result));
	else
		return result;
}